

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latch.cpp
# Opt level: O1

__pid_t __thiscall rtb::Concurrency::Latch::wait(Latch *this,void *__stat_loc)

{
  int iVar1;
  __pid_t extraout_EAX;
  logic_error *this_00;
  unique_lock<std::mutex> mlock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->count_ == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"internal count == 0");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  iVar1 = this->count_ + -1;
  this->count_ = iVar1;
  if (iVar1 == 0) {
    std::condition_variable::notify_all();
  }
  else if (0 < this->count_) {
    do {
      std::condition_variable::wait((unique_lock *)&this->condition_);
    } while (0 < this->count_);
  }
  std::unique_lock<std::mutex>::unlock(&local_28);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return extraout_EAX;
}

Assistant:

void Latch::wait() {
            std::unique_lock<std::mutex> mlock(mutex_);
            if (count_ == 0) {
                throw std::logic_error("internal count == 0");
            }
            if (--count_ == 0)
                condition_.notify_all();
            else {
                while (count_ > 0)
                    condition_.wait(mlock);
            }
            mlock.unlock();
        }